

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMan.c
# Opt level: O3

Mpm_Man_t * Mpm_ManStart(Mig_Man_t *pMig,Mpm_Par_t *pPars)

{
  uint uVar1;
  Mpm_LibLut_t *pMVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  Mpm_Man_t *p;
  Mmr_Step_t *pMVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  int *piVar8;
  Vec_Mem_t *p_00;
  Vec_Int_t *pVVar9;
  int iVar10;
  long lVar11;
  abctime aVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  Mpm_Uni_t *pMVar16;
  word *pEntry;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  timespec ts;
  timespec local_40;
  long lVar22;
  
  if (0x20 < pPars->nNumCuts) {
    __assert_fail("pPars->nNumCuts <= MPM_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMan.c"
                  ,0x32,"Mpm_Man_t *Mpm_ManStart(Mig_Man_t *, Mpm_Par_t *)");
  }
  if ((pPars->fUseTruth != 0) && (0x10 < pPars->pLib->LutMax)) {
    __assert_fail("!pPars->fUseTruth || pPars->pLib->LutMax <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMan.c"
                  ,0x33,"Mpm_Man_t *Mpm_ManStart(Mig_Man_t *, Mpm_Par_t *)");
  }
  if ((pPars->fUseDsd != 0) && (6 < pPars->pLib->LutMax)) {
    __assert_fail("!pPars->fUseDsd || pPars->pLib->LutMax <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMan.c"
                  ,0x34,"Mpm_Man_t *Mpm_ManStart(Mig_Man_t *, Mpm_Par_t *)");
  }
  Mig_ManSetRefs(pMig);
  uVar15 = 1;
  p = (Mpm_Man_t *)calloc(1,0x3688);
  p->pMig = pMig;
  p->pPars = pPars;
  pMVar2 = pPars->pLib;
  p->pLibLut = pMVar2;
  iVar10 = pMVar2->LutMax;
  p->nLutSize = iVar10;
  iVar17 = 1 << ((char)iVar10 - 6U & 0x1f);
  if (iVar10 < 7) {
    iVar17 = 1;
  }
  if (pPars->fUseTruth == 0) {
    iVar17 = 0;
  }
  p->nTruWords = iVar17;
  uVar1 = pPars->nNumCuts;
  uVar18 = (ulong)uVar1;
  uVar14 = 0x1f;
  uVar13 = (uint)((long)(iVar10 << 2) + 0xcU >> 3);
  if (uVar13 != 0) {
    for (; uVar13 >> uVar14 == 0; uVar14 = uVar14 - 1) {
    }
  }
  uVar14 = (uVar14 ^ 0xffffffe0) + 0x21;
  if (uVar13 + 1 < 2) {
    uVar14 = uVar13 + 1;
  }
  uVar13 = 1 << ((byte)uVar14 & 0x1f);
  p->nNumCuts = uVar1;
  pMVar5 = (Mmr_Step_t *)calloc((long)(int)uVar13 * 0x38 + 0x18,1);
  pMVar5->nBits = uVar14;
  pMVar5->uMask = uVar13 - 1;
  if (1 < (int)uVar13) {
    piVar8 = &pMVar5[3].nEntriesAll;
    do {
      if (uVar15 == 0x2000) {
        __assert_fail("nEntryWords > 0 && nEntryWords < (1 << nPageBase)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/mem/mem2.h"
                      ,0x96,"void Mmr_FixedCreate(Mmr_Fixed_t *, int, int)");
      }
      *(undefined8 *)(piVar8 + -2) = 0x1fff0000000d;
      *piVar8 = (int)uVar15;
      uVar15 = uVar15 + 1;
      piVar8 = piVar8 + 0xe;
    } while (uVar13 != uVar15);
  }
  p->pManCuts = pMVar5;
  if ((int)uVar1 < 0) {
    iVar10 = 0;
  }
  else {
    uVar15 = uVar18 + 1;
    ppvVar6 = (void **)malloc(uVar18 * 8 + 8);
    (p->vFreeUnits).pArray = ppvVar6;
    (p->vFreeUnits).nCap = (int)uVar15;
    pMVar16 = p->pCutUnits + uVar18;
    iVar10 = 0;
    uVar18 = uVar15 & 0xffffffff;
    do {
      iVar17 = (int)uVar18;
      if (iVar10 == iVar17) {
        if (iVar17 < 0x10) {
          ppvVar6 = (p->vFreeUnits).pArray;
          if (ppvVar6 == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(ppvVar6,0x80);
          }
          (p->vFreeUnits).pArray = ppvVar6;
          (p->vFreeUnits).nCap = 0x10;
          uVar18 = 0x10;
        }
        else {
          uVar18 = (ulong)(uint)(iVar17 * 2);
          ppvVar6 = (p->vFreeUnits).pArray;
          if (ppvVar6 == (void **)0x0) {
            ppvVar6 = (void **)malloc(uVar18 * 8);
          }
          else {
            ppvVar6 = (void **)realloc(ppvVar6,uVar18 * 8);
          }
          (p->vFreeUnits).pArray = ppvVar6;
          (p->vFreeUnits).nCap = iVar17 * 2;
        }
      }
      else {
        ppvVar6 = (p->vFreeUnits).pArray;
      }
      iVar17 = (p->vFreeUnits).nSize;
      iVar10 = iVar17 + 1;
      (p->vFreeUnits).nSize = iVar10;
      ppvVar6[iVar17] = pMVar16;
      pMVar16 = pMVar16 + -1;
      uVar19 = uVar15 - 1;
      bVar3 = 0 < (long)uVar15;
      uVar15 = uVar19;
    } while (uVar19 != 0 && bVar3);
    iVar10 = (p->vCutBests).nCap;
  }
  pVVar7 = (Vec_Ptr_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  pVVar7->pArray = ppvVar6;
  p->vTemp = pVVar7;
  uVar1 = pMig->nObjs;
  if (iVar10 < (int)uVar1) {
    piVar8 = (p->vCutBests).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar1 << 2);
    }
    (p->vCutBests).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_00482501;
    (p->vCutBests).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vCutBests).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vCutBests).nSize = uVar1;
  uVar1 = pMig->nObjs;
  if ((p->vCutLists).nCap < (int)uVar1) {
    piVar8 = (p->vCutLists).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar1 << 2);
    }
    (p->vCutLists).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_00482501;
    (p->vCutLists).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vCutLists).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vCutLists).nSize = uVar1;
  uVar1 = pMig->nObjs;
  if ((p->vMigRefs).nCap < (int)uVar1) {
    piVar8 = (p->vMigRefs).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar1 << 2);
    }
    (p->vMigRefs).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_00482501;
    (p->vMigRefs).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vMigRefs).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vMigRefs).nSize = uVar1;
  uVar1 = pMig->nObjs;
  if ((p->vMapRefs).nCap < (int)uVar1) {
    piVar8 = (p->vMapRefs).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar1 << 2);
    }
    (p->vMapRefs).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_00482501;
    (p->vMapRefs).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vMapRefs).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vMapRefs).nSize = uVar1;
  uVar1 = pMig->nObjs;
  if ((p->vEstRefs).nCap < (int)uVar1) {
    piVar8 = (p->vEstRefs).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar1 << 2);
    }
    (p->vEstRefs).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_00482501;
    (p->vEstRefs).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vEstRefs).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vEstRefs).nSize = uVar1;
  uVar1 = pMig->nObjs;
  if ((p->vRequireds).nCap < (int)uVar1) {
    piVar8 = (p->vRequireds).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar1 << 2);
    }
    (p->vRequireds).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_00482501;
    (p->vRequireds).nCap = uVar1;
  }
  auVar4 = _DAT_0094e250;
  if (0 < (int)uVar1) {
    piVar8 = (p->vRequireds).pArray;
    lVar11 = (ulong)uVar1 - 1;
    auVar20._8_4_ = (int)lVar11;
    auVar20._0_8_ = lVar11;
    auVar20._12_4_ = (int)((ulong)lVar11 >> 0x20);
    lVar11 = 0;
    auVar20 = auVar20 ^ _DAT_0094e250;
    auVar21 = _DAT_0094f530;
    auVar23 = _DAT_0094e240;
    do {
      auVar24 = auVar23 ^ auVar4;
      iVar10 = auVar20._4_4_;
      if ((bool)(~(auVar24._4_4_ == iVar10 && auVar20._0_4_ < auVar24._0_4_ ||
                  iVar10 < auVar24._4_4_) & 1)) {
        *(undefined4 *)((long)piVar8 + lVar11) = 1000000000;
      }
      if ((auVar24._12_4_ != auVar20._12_4_ || auVar24._8_4_ <= auVar20._8_4_) &&
          auVar24._12_4_ <= auVar20._12_4_) {
        *(undefined4 *)((long)piVar8 + lVar11 + 4) = 1000000000;
      }
      auVar24 = auVar21 ^ auVar4;
      iVar17 = auVar24._4_4_;
      if (iVar17 <= iVar10 && (iVar17 != iVar10 || auVar24._0_4_ <= auVar20._0_4_)) {
        *(undefined4 *)((long)piVar8 + lVar11 + 8) = 1000000000;
        *(undefined4 *)((long)piVar8 + lVar11 + 0xc) = 1000000000;
      }
      lVar22 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 4;
      auVar23._8_8_ = lVar22 + 4;
      lVar22 = auVar21._8_8_;
      auVar21._0_8_ = auVar21._0_8_ + 4;
      auVar21._8_8_ = lVar22 + 4;
      lVar11 = lVar11 + 0x10;
    } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar11);
  }
  (p->vRequireds).nSize = uVar1;
  uVar1 = pMig->nObjs;
  if ((p->vTimes).nCap < (int)uVar1) {
    piVar8 = (p->vTimes).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar1 << 2);
    }
    (p->vTimes).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_00482501;
    (p->vTimes).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vTimes).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vTimes).nSize = uVar1;
  uVar1 = pMig->nObjs;
  if ((p->vAreas).nCap < (int)uVar1) {
    piVar8 = (p->vAreas).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar1 << 2);
    }
    (p->vAreas).pArray = piVar8;
    if (piVar8 == (int *)0x0) goto LAB_00482501;
    (p->vAreas).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vAreas).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vAreas).nSize = uVar1;
  uVar1 = pMig->nObjs;
  if ((p->vEdges).nCap < (int)uVar1) {
    piVar8 = (p->vEdges).pArray;
    if (piVar8 == (int *)0x0) {
      piVar8 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar8 = (int *)realloc(piVar8,(long)(int)uVar1 << 2);
    }
    (p->vEdges).pArray = piVar8;
    if (piVar8 == (int *)0x0) {
LAB_00482501:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vEdges).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p->vEdges).pArray,0,(ulong)uVar1 * 4);
  }
  (p->vEdges).nSize = uVar1;
  iVar10 = p->pPars->fUseDsd;
  if (p->pPars->fUseTruth == 0) {
    if (iVar10 == 0) goto LAB_0048247d;
    Mpm_ManPrecomputePerms(p);
    iVar10 = 1;
  }
  else {
    if (iVar10 != 0) {
      __assert_fail("!p->pPars->fUseTruth || !p->pPars->fUseDsd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmMan.c"
                    ,0x50,"Mpm_Man_t *Mpm_ManStart(Mig_Man_t *, Mpm_Par_t *)");
    }
    iVar10 = p->nTruWords;
    p_00 = (Vec_Mem_t *)calloc(1,0x30);
    p_00->nEntrySize = iVar10;
    p_00->LogPageSze = 0xc;
    p_00->PageMask = 0xfff;
    p_00->iPage = -1;
    p->vTtMem = p_00;
    uVar1 = 9999;
    while( true ) {
      do {
        uVar14 = uVar1;
        uVar1 = uVar14 + 1;
      } while ((uVar14 & 1) != 0);
      if (uVar1 < 9) break;
      iVar10 = 5;
      while (uVar1 % (iVar10 - 2U) != 0) {
        uVar13 = iVar10 * iVar10;
        iVar10 = iVar10 + 2;
        if (uVar1 < uVar13) goto LAB_004823aa;
      }
    }
LAB_004823aa:
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    uVar13 = 0x10;
    if (0xe < uVar14) {
      uVar13 = uVar1;
    }
    pVVar9->nCap = uVar13;
    piVar8 = (int *)malloc((long)(int)uVar13 << 2);
    pVVar9->pArray = piVar8;
    pVVar9->nSize = uVar1;
    if (piVar8 != (int *)0x0) {
      memset(piVar8,0xff,(long)(int)uVar1 << 2);
    }
    p_00->vTable = pVVar9;
    pVVar9 = (Vec_Int_t *)malloc(0x10);
    pVVar9->nCap = 10000;
    pVVar9->nSize = 0;
    piVar8 = (int *)malloc(40000);
    pVVar9->pArray = piVar8;
    p_00->vNexts = pVVar9;
    pEntry = p->Truth;
    iVar10 = Vec_MemHashInsert(p_00,pEntry);
    p->funcCst0 = iVar10;
    if (0 < (long)p->nTruWords) {
      memset(pEntry,0xaa,(long)p->nTruWords << 3);
    }
    iVar10 = Vec_MemHashInsert(p->vTtMem,pEntry);
  }
  p->funcVar0 = iVar10;
LAB_0048247d:
  iVar10 = clock_gettime(3,&local_40);
  if (iVar10 < 0) {
    aVar12 = -1;
  }
  else {
    aVar12 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeTotal = aVar12;
  pMig->pMan = p;
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mpm_Man_t * Mpm_ManStart( Mig_Man_t * pMig, Mpm_Par_t * pPars )
{
    Mpm_Man_t * p;
    int i;
    assert( sizeof(Mpm_Uni_t) % sizeof(word) == 0 );      // aligned info to word boundary
    assert( pPars->nNumCuts <= MPM_CUT_MAX );
    assert( !pPars->fUseTruth || pPars->pLib->LutMax <= 16 );
    assert( !pPars->fUseDsd || pPars->pLib->LutMax <= 6 );
    Mig_ManSetRefs( pMig );
    // alloc
    p = ABC_CALLOC( Mpm_Man_t, 1 );
    p->pMig      = pMig;
    p->pPars     = pPars;
    p->pLibLut   = pPars->pLib;
    p->nLutSize  = pPars->pLib->LutMax;
    p->nTruWords = pPars->fUseTruth ? Abc_Truth6WordNum(p->nLutSize) : 0;
    p->nNumCuts  = pPars->nNumCuts;
    // cuts
    assert( Mpm_CutWordNum(32) < 32 ); // using 5 bits for word count
    p->pManCuts  = Mmr_StepStart( 13, Abc_Base2Log(Mpm_CutWordNum(p->nLutSize) + 1) );
    Vec_PtrGrow( &p->vFreeUnits, p->nNumCuts + 1 );
    for ( i = p->nNumCuts; i >= 0; i-- )
        Vec_PtrPush( &p->vFreeUnits, p->pCutUnits + i );
    p->vTemp     = Vec_PtrAlloc( 1000 );
    // mapping attributes
    Vec_IntFill( &p->vCutBests, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vCutLists, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vMigRefs, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vMapRefs, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vEstRefs, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vRequireds, Mig_ManObjNum(pMig), ABC_INFINITY );
    Vec_IntFill( &p->vTimes, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vAreas, Mig_ManObjNum(pMig), 0 );
    Vec_IntFill( &p->vEdges, Mig_ManObjNum(pMig), 0 );
    // start DSD manager
    assert( !p->pPars->fUseTruth || !p->pPars->fUseDsd );
    if ( p->pPars->fUseTruth )
    { 
        p->vTtMem = Vec_MemAlloc( p->nTruWords, 12 ); // 32 KB/page for 6-var functions
        Vec_MemHashAlloc( p->vTtMem, 10000 );
        p->funcCst0 = Vec_MemHashInsert( p->vTtMem, p->Truth );
        Abc_TtUnit( p->Truth, p->nTruWords, 0 );
        p->funcVar0 = Vec_MemHashInsert( p->vTtMem, p->Truth );
    }
    else if ( p->pPars->fUseDsd )
    {
        Mpm_ManPrecomputePerms( p );
        p->funcVar0 = 1;
    }
    // finish
    p->timeTotal = Abc_Clock();
    pMig->pMan = p;
    return p;
}